

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1525.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 != 0) {
      lVar3 = curl_slist_append(0,"User-Agent: Http Agent");
      if (lVar3 == 0) {
        iVar1 = 2;
      }
      else {
        iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
        if (((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x2714,libtest_arg2), iVar1 == 0)) &&
             (iVar1 = curl_easy_setopt(lVar2,0x2727,lVar3), iVar1 == 0)) &&
            (((iVar1 = curl_easy_setopt(lVar2,0x27f4,lVar3), iVar1 == 0 &&
              (iVar1 = curl_easy_setopt(lVar2,0xe5,0), iVar1 == 0)) &&
             ((iVar1 = curl_easy_setopt(lVar2,0x2f,0), iVar1 == 0 &&
              ((iVar1 = curl_easy_setopt(lVar2,0x2e,1), iVar1 == 0 &&
               (iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0)))))))) &&
           ((iVar1 = curl_easy_setopt(lVar2,0x65,0), iVar1 == 0 &&
            ((((iVar1 = curl_easy_setopt(lVar2,0x2a,1), iVar1 == 0 &&
               (iVar1 = curl_easy_setopt(lVar2,0x4e2b,fwrite), iVar1 == 0)) &&
              (iVar1 = curl_easy_setopt(lVar2,0x4e2c,read_callback), iVar1 == 0)) &&
             (iVar1 = curl_easy_setopt(lVar2,0x3d,1), iVar1 == 0)))))) {
          sVar4 = strlen(data);
          iVar1 = curl_easy_setopt(lVar2,0xe,sVar4);
          if (iVar1 == 0) {
            iVar1 = curl_easy_perform(lVar2);
          }
        }
      }
      curl_easy_cleanup(lVar2);
      curl_slist_free_all(lVar3);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_FAILED_INIT;
  /* http and proxy header list*/
  struct curl_slist *hhl = NULL;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  hhl = curl_slist_append(hhl, "User-Agent: Http Agent");

  if(!hhl) {
    goto test_cleanup;
  }

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_PROXY, libtest_arg2);
  test_setopt(curl, CURLOPT_HTTPHEADER, hhl);
  test_setopt(curl, CURLOPT_PROXYHEADER, hhl);
  test_setopt(curl, CURLOPT_HEADEROPT, CURLHEADER_UNIFIED);
  test_setopt(curl, CURLOPT_POST, 0L);
  test_setopt(curl, CURLOPT_UPLOAD, 1L);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
  test_setopt(curl, CURLOPT_HEADER, 1L);
  test_setopt(curl, CURLOPT_WRITEFUNCTION, fwrite);
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);
  test_setopt(curl, CURLOPT_HTTPPROXYTUNNEL, 1L);
  test_setopt(curl, CURLOPT_INFILESIZE, strlen(data));

  res = curl_easy_perform(curl);

test_cleanup:

  curl_easy_cleanup(curl);

  curl_slist_free_all(hhl);

  curl_global_cleanup();

  return (int)res;
}